

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitview.h
# Opt level: O1

int __thiscall
bv::internal::bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
copy(bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *this,
    EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  _Elt_pointer puVar1;
  sbyte sVar2;
  int extraout_EAX;
  int iVar3;
  word_type wVar4;
  ulong uVar5;
  ulong *puVar6;
  _Map_pointer ppuVar7;
  EVP_PKEY_CTX *in_RCX;
  EVP_PKEY_CTX *end;
  long lVar8;
  _Elt_pointer puVar9;
  ulong uVar10;
  word_type *pwVar11;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  ulong uVar15;
  EVP_PKEY_CTX *in_R8;
  long in_R9;
  ulong uVar16;
  EVP_PKEY_CTX *pEVar17;
  EVP_PKEY_CTX *begin;
  ulong uVar18;
  ulong uVar19;
  
  uVar16 = in_R9 - (long)in_R8;
  end = src + uVar16;
  if ((ulong)((long)in_RCX - (long)src) <= uVar16) {
    end = in_RCX;
    uVar16 = (long)in_RCX - (long)src;
  }
  pEVar17 = in_R8 + uVar16;
  if (in_R8 <= src || (EVP_PKEY_CTX *)this != dst) {
    uVar18 = (ulong)in_R8 >> 6;
    uVar13 = (ulong)((uint)in_R8 & 0x3f);
    uVar19 = (ulong)pEVar17 >> 6;
    uVar16 = 0;
    if (uVar18 == uVar19) {
      uVar16 = (ulong)pEVar17 | 0xffffffffffffffc0;
    }
    pEVar17 = src + uVar16 + (0x40 - uVar13);
    wVar4 = get((bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
                 *)dst,(size_t)src,(size_t)pEVar17);
    puVar1 = (this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    uVar5 = ((long)puVar1 -
             (long)(this->_container).
                   super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Deque_impl_data._M_start._M_first >> 3) + uVar18;
    if (uVar5 < 0x40) {
      puVar9 = puVar1 + uVar18;
    }
    else {
      uVar10 = uVar5 >> 6 | 0xfc00000000000000;
      if (0 < (long)uVar5) {
        uVar10 = uVar5 >> 6;
      }
      puVar9 = (this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node[uVar10] + uVar5 + uVar10 * -0x40;
    }
    bVar14 = 0x40 - (-(char)in_R8 & 0x3fU);
    sVar2 = (bVar14 < 0x41) * ('@' - bVar14);
    uVar10 = (*puVar9 << sVar2) >> sVar2;
    if (uVar13 == 0) {
      uVar10 = 0;
    }
    if (uVar5 < 0x40) {
      puVar6 = puVar1 + uVar18;
    }
    else {
      uVar15 = uVar5 >> 6 | 0xfc00000000000000;
      if (0 < (long)uVar5) {
        uVar15 = uVar5 >> 6;
      }
      puVar6 = (this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node[uVar15] + uVar5 + uVar15 * -0x40;
    }
    uVar15 = 0;
    if (uVar18 == uVar19) {
      uVar15 = (*puVar6 >> (uVar16 & 0x3f)) << (uVar16 & 0x3f);
    }
    if (uVar5 < 0x40) {
      puVar6 = puVar1 + uVar18;
    }
    else {
      uVar16 = uVar5 >> 6 | 0xfc00000000000000;
      if (0 < (long)uVar5) {
        uVar16 = uVar5 >> 6;
      }
      puVar6 = (this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node[uVar16] + uVar5 + uVar16 * -0x40;
    }
    *puVar6 = uVar10 | wVar4 << uVar13 | uVar15;
    uVar16 = uVar18 + 1;
    if (uVar16 < uVar19) {
      lVar12 = uVar18 * 8;
      begin = pEVar17;
      do {
        lVar12 = lVar12 + 8;
        pEVar17 = begin + 0x40;
        puVar6 = (ulong *)get((bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
                               *)dst,(size_t)begin,(size_t)pEVar17);
        puVar1 = (this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar8 = (long)puVar1 -
                (long)(this->_container).
                      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Deque_impl_data._M_start._M_first >> 3;
        uVar13 = uVar16 + lVar8;
        if (uVar13 < 0x40) {
          pwVar11 = (word_type *)((long)puVar1 + lVar12);
        }
        else {
          uVar18 = uVar13 >> 6 | 0xfc00000000000000;
          if (0 < (long)uVar13) {
            uVar18 = uVar13 >> 6;
          }
          pwVar11 = (this->_container).
                    super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node[uVar18] +
                    lVar8 + uVar18 * -0x40 + uVar16;
        }
        *pwVar11 = (word_type)puVar6;
        uVar16 = uVar16 + 1;
        begin = pEVar17;
      } while (uVar19 != uVar16);
    }
    iVar3 = (int)puVar6;
    lVar12 = (long)pEVar17 - (long)end;
    if (lVar12 != 0) {
      ppuVar7 = (_Map_pointer)
                get((bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
                     *)dst,(size_t)pEVar17,(size_t)end);
      puVar1 = (this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar16 = ((long)puVar1 -
                (long)(this->_container).
                      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Deque_impl_data._M_start._M_first >> 3) + uVar19;
      if (uVar16 < 0x40) {
        puVar6 = puVar1 + uVar19;
      }
      else {
        uVar13 = uVar16 >> 6 | 0xfc00000000000000;
        if (0 < (long)uVar16) {
          uVar13 = uVar16 >> 6;
        }
        puVar6 = (this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node[uVar13] + uVar16 + uVar13 * -0x40;
      }
      uVar13 = 0;
      if (lVar12 != -0x40) {
        uVar13 = (*puVar6 >> ((ulong)(byte)-(char)lVar12 & 0x3f)) <<
                 ((ulong)(byte)-(char)lVar12 & 0x3f);
      }
      uVar13 = uVar13 | (ulong)ppuVar7;
      if (uVar16 < 0x40) {
        puVar6 = puVar1 + uVar19;
      }
      else {
        ppuVar7 = (this->_container).
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node;
        uVar18 = uVar16 >> 6 | 0xfc00000000000000;
        if (0 < (long)uVar16) {
          uVar18 = uVar16 >> 6;
        }
        puVar6 = ppuVar7[uVar18] + uVar16 + uVar18 * -0x40;
      }
      iVar3 = (int)ppuVar7;
      *puVar6 = uVar13;
    }
    return iVar3;
  }
  copy_backward<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
            (this,(bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
                   *)dst,(size_t)src,(size_t)end,(size_t)in_R8,(size_t)pEVar17);
  return extraout_EAX;
}

Assistant:

void bitview<Container>::copy(bitview const&src,
                                      size_t src_begin, size_t src_end,
                                      size_t dest_begin, size_t dest_end)
        {
            size_t srclen = src_end - src_begin;
            size_t destlen = dest_end - dest_begin;
            
            if(destlen < srclen) {
                src_end = src_begin + destlen;
                srclen  = destlen;
            }
            
            if(this == &src && src_begin < dest_begin)
                copy_backward(src, src_begin, src_end, 
                              dest_begin, dest_begin + srclen);
            else
                copy_forward(src, src_begin, src_end, 
                             dest_begin, dest_begin + srclen);
        }